

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<nonstd::expected_lite::expected<int,char>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::expected_lite::expected<int,char>const&> *this,
          unexpected_type<char> *rhs)

{
  lest lVar1;
  lest lVar2;
  lest lVar3;
  lest *this_00;
  unexpected_type<char> *in_R8;
  allocator<char> local_71;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  lVar1 = *this_00;
  lVar2 = this_00[4];
  lVar3 = (lest)rhs->m_error;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"==",&local_71);
  to_string<nonstd::expected_lite::expected<int,char>,nonstd::expected_lite::unexpected_type<char>>
            (&local_70,this_00,(expected<int,_char> *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = (bool)(lVar1 == lVar3 & ~(byte)lVar2);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }